

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::ClusterList::~ClusterList(ClusterList *this)

{
  iterator End;
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)this;
  while (p_Var1 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
                  super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this) {
    operator_delete(p_Var1[1]._M_next,0x30);
  }
  std::__cxx11::_List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::_M_clear
            ((_List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)this);
  return;
}

Assistant:

ClusterList::~ClusterList ()
{
    for (std::list<Cluster*>::iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        delete *cli;
    }
}